

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O1

void __thiscall gdsAREF::reset(gdsAREF *this)

{
  std::__cxx11::string::_M_replace
            ((ulong)&this->name,0,(char *)(this->name)._M_string_length,0x1763d5);
  (this->aref_transformation_flags).super__Base_bitset<1UL>._M_w = 0;
  this->reflection = false;
  this->angle = 0.0;
  this->scale = 1.0;
  this->colCnt = 0;
  this->rowCnt = 0;
  this->xCor = 0;
  this->yCor = 0;
  this->xCorRow = 0;
  this->yCorRow = 0;
  this->xCorCol = 0;
  this->yCorCol = 0;
  this->propattr = 0;
  std::__cxx11::string::_M_replace
            ((ulong)&this->propvalue,0,(char *)(this->propvalue)._M_string_length,0x1763d5);
  return;
}

Assistant:

void gdsAREF::reset()
{
  name = "\0";
  aref_transformation_flags.reset();
  reflection = false;
  angle = 0;
  scale = 1;
  colCnt = 0;
  rowCnt = 0;
  xCor = 0;
  yCor = 0;
  xCorRow = 0; // X_2
  yCorRow = 0; // Y_2
  xCorCol = 0; // X_3
  yCorCol = 0; // Y_3
  propattr = 0;
  propvalue = "\0";
}